

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_net_methods.cpp
# Opt level: O2

void Marshall_string_proc(int the_socket,Am_Value *in_value,Am_Connection *my_connection_ptr)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  Am_String in_am_str;
  long net_size;
  
  Am_String::Am_String(&in_am_str,in_value);
  pcVar2 = Am_String::operator_cast_to_char_(&in_am_str);
  sVar3 = strlen(pcVar2);
  uVar1 = (uint)(sVar3 + 1);
  net_size = (long)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18)
  ;
  pcVar2 = Am_String::operator_cast_to_char_(&in_am_str);
  send(the_socket,&net_size,8,0);
  send(the_socket,pcVar2,sVar3 + 1,0);
  Am_String::~Am_String(&in_am_str);
  return;
}

Assistant:

Am_Define_Method(Am_Marshall_Method, void, Marshall_string,
                 (int the_socket, const Am_Value &in_value,
                  Am_Connection *my_connection_ptr))
{
  (void)my_connection_ptr; //avoid warning,  used by Lists & Obj
  Am_String in_am_str = in_value;
  long size = strlen((const char *)in_am_str) + 1;
  long net_size = htonl(size);
  const char *in_str = in_am_str;
  send(the_socket, &net_size, sizeof(net_size), 0);
  send(the_socket, in_str, size, 0);
}